

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O0

TapBranch * __thiscall
cfd::core::TapBranch::ChangeTapLeaf
          (TapBranch *__return_storage_ptr__,TapBranch *this,Script *tapscript,
          vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *target_nodes)

{
  pointer puVar1;
  ulong uVar2;
  value_type *pvVar3;
  bool bVar4;
  CfdException *pCVar5;
  iterator __first;
  reference this_00;
  value_type *pvVar6;
  reference pvVar7;
  size_type sVar8;
  reference bytedata;
  value_type *pvVar9;
  reference pvVar10;
  const_reference __args;
  const_reference pvVar11;
  CfdException *pCVar12;
  reference tap_tree;
  allocator local_3e1;
  string local_3e0;
  CfdException *anon_var_0;
  size_t idx_4;
  size_t idx_3;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> copy_branches;
  TapBranch based_branch;
  undefined1 local_300 [8];
  TapBranch new_branch;
  size_t idx_2;
  size_t copy_len;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> check_nodes_1;
  value_type *checked_size;
  value_type *target_index;
  size_t index_1;
  ulong local_240;
  size_t idx_1;
  undefined1 local_230 [7];
  bool has_match;
  string hex;
  ByteData256 *node_1;
  iterator __end5;
  iterator __begin5;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *__range5;
  string check_nodes_str;
  ByteData256 local_1b8;
  value_type *local_1a0;
  size_t idx;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> branch_nodes;
  undefined1 local_178 [8];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> check_nodes;
  value_type *branch;
  size_t index;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> new_branches;
  vector<unsigned_long,_std::allocator<unsigned_long>_> checked_nodes_size_list;
  vector<unsigned_long,_std::allocator<unsigned_long>_> target_branch_indexes;
  ByteData256 *node;
  iterator __end2;
  iterator __begin2;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *__range2;
  string reverse_nodes_str;
  undefined1 local_98 [8];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> reverse_nodes;
  undefined1 local_78 [8];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  allocator local_49;
  string local_48;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *local_28;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *target_nodes_local;
  Script *tapscript_local;
  TapBranch *this_local;
  
  local_28 = target_nodes;
  target_nodes_local =
       (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)tapscript;
  tapscript_local = (Script *)this;
  this_local = __return_storage_ptr__;
  bVar4 = IsFindTapScript(this,tapscript);
  if (!bVar4) {
    nodes.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_48,"This tapscript not exist in this tree.",&local_49);
    CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_48);
    nodes.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  (*this->_vptr_TapBranch[4])(local_78);
  if ((((this->has_leaf_ & 1U) == 0) ||
      (bVar4 = Script::Equals(&this->script_,(Script *)target_nodes_local), !bVar4)) ||
     ((bVar4 = ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::empty
                         (local_28), !bVar4 &&
      (bVar4 = ::std::operator==(local_28,(vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                                           *)local_78), !bVar4)))) {
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_98,
               local_28);
    bVar4 = ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::empty
                      ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                       local_98);
    if (!bVar4) {
      __first = ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
                begin((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                      local_98);
      reverse_nodes_str.field_2._8_8_ =
           ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::end
                     ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                      local_98);
      ::std::
      reverse<__gnu_cxx::__normal_iterator<cfd::core::ByteData256*,std::vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>>>>
                ((__normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
                  )__first._M_current,
                 (__normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
                  )reverse_nodes_str.field_2._8_8_);
    }
    ::std::__cxx11::string::string((string *)&__range2);
    __end2 = ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::begin
                       ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                        local_98);
    node = (ByteData256 *)
           ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::end
                     ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                      local_98);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
                                       *)&node), bVar4) {
      this_00 = __gnu_cxx::
                __normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
                ::operator*(&__end2);
      ByteData256::GetHex_abi_cxx11_
                ((string *)
                 &target_branch_indexes.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,this_00);
      ::std::__cxx11::string::operator+=
                ((string *)&__range2,
                 (string *)
                 &target_branch_indexes.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &target_branch_indexes.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      __gnu_cxx::
      __normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
      ::operator++(&__end2);
    }
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &checked_nodes_size_list.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &new_branches.
                super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::vector
              ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&index);
    for (branch = (value_type *)0x0; pvVar3 = branch,
        pvVar6 = (value_type *)
                 ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::size
                           (&this->branch_list_), pvVar3 < pvVar6;
        branch = (value_type *)((long)&branch->_vptr_TapBranch + 1)) {
      check_nodes.
      super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::
                    operator[](&this->branch_list_,(size_type)branch);
      bVar4 = IsFindTapScript((TapBranch *)
                              check_nodes.
                              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (Script *)target_nodes_local);
      if (bVar4) {
        ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
                  ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                   local_178);
        bVar4 = ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
                empty((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                      local_98);
        if (bVar4) {
          ::std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                     &checked_nodes_size_list.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(unsigned_long *)&branch);
          branch_nodes.
          super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<int>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &new_branches.
                      super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (int *)((long)&branch_nodes.
                                    super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        }
        else {
          (**(code **)(((check_nodes.
                         super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->data_).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + 0x20))(&idx);
          local_1a0 = (value_type *)
                      ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                      ::size((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                              *)local_78);
          while (local_1a0 = (value_type *)
                             ((long)&local_1a0[-1].branch_list_.
                                     super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                branch < local_1a0) {
            pvVar7 = ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                     ::operator[]((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                                   *)local_78,(size_type)local_1a0);
            ::std::vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>>::
            emplace_back<cfd::core::ByteData256&>
                      ((vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>> *)
                       local_178,pvVar7);
          }
          if (branch == (value_type *)0x0) {
            GetBaseHash(&local_1b8,this);
            ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
            emplace_back<cfd::core::ByteData256>
                      ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                       local_178,&local_1b8);
            ByteData256::~ByteData256(&local_1b8);
          }
          else {
            GetBranchHash((ByteData256 *)((long)&check_nodes_str.field_2 + 8),this,
                          (char)branch + 0xff);
            ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
            emplace_back<cfd::core::ByteData256>
                      ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                       local_178,(ByteData256 *)((long)&check_nodes_str.field_2 + 8));
            ByteData256::~ByteData256((ByteData256 *)((long)&check_nodes_str.field_2 + 8));
          }
          ::std::__cxx11::string::string((string *)&__range5);
          __end5 = ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
                   begin((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                         local_178);
          node_1 = (ByteData256 *)
                   ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
                   end((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                       local_178);
          while (bVar4 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
                                             *)&node_1), bVar4) {
            hex.field_2._8_8_ =
                 __gnu_cxx::
                 __normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
                 ::operator*(&__end5);
            ByteData256::GetHex_abi_cxx11_((string *)local_230,(ByteData256 *)hex.field_2._8_8_);
            ::std::__cxx11::string::operator+=((string *)&__range5,(string *)local_230);
            ::std::__cxx11::string::~string((string *)local_230);
            __gnu_cxx::
            __normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
            ::operator++(&__end5);
          }
          idx_1._7_1_ = 1;
          for (local_240 = 0; uVar2 = local_240,
              sVar8 = ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                      ::size((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                              *)local_178), uVar2 < sVar8; local_240 = local_240 + 1) {
            pvVar7 = ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                     ::operator[]((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                                   *)local_98,local_240);
            bytedata = ::std::
                       vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
                       operator[]((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                                   *)local_178,local_240);
            bVar4 = ByteData256::Equals(pvVar7,bytedata);
            if (!bVar4) {
              idx_1._7_1_ = 0;
              break;
            }
          }
          if ((idx_1._7_1_ & 1) != 0) {
            ::std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                       &checked_nodes_size_list.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(unsigned_long *)&branch);
            index_1 = ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                      ::size((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                              *)local_178);
            ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            emplace_back<unsigned_long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &new_branches.
                        super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&index_1);
          }
          ::std::__cxx11::string::~string((string *)&__range5);
          ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                    ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&idx
                    );
        }
        ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                  ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                   local_178);
      }
    }
    for (target_index = (value_type *)0x0;
        pvVar9 = (value_type *)
                 ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            &checked_nodes_size_list.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage),
        target_index < pvVar9; target_index = (value_type *)((long)target_index + 1)) {
      pvVar10 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &checked_nodes_size_list.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (size_type)target_index);
      check_nodes_1.
      super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &new_branches.
                                super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)target_index);
      ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
                ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                 &copy_len);
      bVar4 = ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::empty
                        (local_28);
      if (!bVar4) {
        sVar8 = ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::size
                          (local_28);
        puVar1 = ((check_nodes_1.
                   super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->data_).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (new_branch.branch_list_.
             super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            new_branch.branch_list_.
            super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage < (pointer)(sVar8 - (long)puVar1);
            new_branch.branch_list_.
            super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)((long)&(new_branch.branch_list_.
                                   super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                  _vptr_TapBranch + 1)) {
          __args = ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
                   operator[](local_28,(size_type)
                                       new_branch.branch_list_.
                                       super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          ::std::vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>>::
          emplace_back<cfd::core::ByteData256_const&>
                    ((vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>> *)
                     &copy_len,__args);
        }
      }
      pvVar11 = ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::
                operator[](&this->branch_list_,*pvVar10);
      ChangeTapLeaf((TapBranch *)local_300,pvVar11,(Script *)target_nodes_local,
                    (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                    &copy_len);
      GetBaseHash((ByteData256 *)
                  &based_branch.branch_list_.
                   super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,(TapBranch *)local_300);
      bVar4 = ByteData256::IsEmpty
                        ((ByteData256 *)
                         &based_branch.branch_list_.
                          super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ByteData256::~ByteData256
                ((ByteData256 *)
                 &based_branch.branch_list_.
                  super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar4) {
        reverse_nodes.
        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 0x11;
      }
      else {
        TapBranch((TapBranch *)
                  &copy_branches.
                   super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,this);
        ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::vector
                  ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&idx_3);
        for (idx_4 = 0; idx_4 < *pvVar10; idx_4 = idx_4 + 1) {
          pvVar11 = ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::
                    operator[](&this->branch_list_,idx_4);
          ::std::vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>>::
          emplace_back<cfd::core::TapBranch_const&>
                    ((vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>> *)&idx_3,
                     pvVar11);
        }
        ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::operator=
                  ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)
                   &based_branch.root_commitment_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&idx_3);
        AddBranch((TapBranch *)local_300,
                  (TapBranch *)
                  &copy_branches.
                   super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
        anon_var_0 = (CfdException *)*pvVar10;
        while( true ) {
          anon_var_0 = (CfdException *)&anon_var_0->field_0x1;
          pCVar5 = anon_var_0;
          pCVar12 = (CfdException *)
                    ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::size
                              (&this->branch_list_);
          if (pCVar12 <= pCVar5) break;
          pvVar11 = ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::
                    operator[](&this->branch_list_,(size_type)anon_var_0);
          AddBranch((TapBranch *)local_300,pvVar11);
        }
        ::std::vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>>::
        emplace_back<cfd::core::TapBranch&>
                  ((vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>> *)&index,
                   (TapBranch *)local_300);
        ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
                  ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&idx_3);
        ~TapBranch((TapBranch *)
                   &copy_branches.
                    super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        reverse_nodes.
        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      }
      ~TapBranch((TapBranch *)local_300);
      if (reverse_nodes.
          super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
        reverse_nodes.
        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      }
      ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                 &copy_len);
    }
    bVar4 = ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::empty
                      ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&index
                      );
    if (bVar4) {
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_3e0,"The specified tapscript does not exist under this branch.",
                 &local_3e1);
      CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_3e0);
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
    tap_tree = ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::
               operator[]((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)
                          &index,0);
    TapBranch(__return_storage_ptr__,tap_tree);
    reverse_nodes.
    super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
              ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&index);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &new_branches.
                super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &checked_nodes_size_list.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ::std::__cxx11::string::~string((string *)&__range2);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_98);
  }
  else {
    TapBranch(__return_storage_ptr__,this);
    reverse_nodes.
    super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_78);
  return __return_storage_ptr__;
}

Assistant:

TapBranch TapBranch::ChangeTapLeaf(
    const Script& tapscript,
    const std::vector<ByteData256>& target_nodes) const {
  if (!IsFindTapScript(tapscript)) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "This tapscript not exist in this tree.");
  }
  auto nodes = GetNodeList();
  if (has_leaf_ && script_.Equals(tapscript)) {
    if (target_nodes.empty() || (target_nodes == nodes)) return *this;
  }

  auto reverse_nodes = target_nodes;
  if (!reverse_nodes.empty()) {
    std::reverse(reverse_nodes.begin(), reverse_nodes.end());
  }
  std::string reverse_nodes_str;
  for (const auto& node : reverse_nodes) reverse_nodes_str += node.GetHex();

  std::vector<size_t> target_branch_indexes;
  std::vector<size_t> checked_nodes_size_list;

  std::vector<TapBranch> new_branches;
  for (size_t index = 0; index < branch_list_.size(); ++index) {
    const auto& branch = branch_list_[index];
    if (branch.IsFindTapScript(tapscript)) {
      std::vector<ByteData256> check_nodes;
      if (reverse_nodes.empty()) {
        target_branch_indexes.emplace_back(index);
        checked_nodes_size_list.emplace_back(0);
      } else {
        auto branch_nodes = branch.GetNodeList();
        for (size_t idx = nodes.size() - 1; idx > index; --idx) {
          check_nodes.emplace_back(nodes[idx]);
        }
        if (index == 0) {
          check_nodes.emplace_back(GetBaseHash());
        } else {
          check_nodes.emplace_back(
              GetBranchHash(static_cast<uint8_t>(index - 1)));
        }

        std::string check_nodes_str;
        for (const auto& node : check_nodes) {
          auto hex = node.GetHex();
          check_nodes_str += hex;
        }

        bool has_match = true;
        for (size_t idx = 0; idx < check_nodes.size(); ++idx) {
          if (!reverse_nodes[idx].Equals(check_nodes[idx])) {
            has_match = false;
            break;
          }
        }
        if (has_match) {
          target_branch_indexes.emplace_back(index);
          checked_nodes_size_list.emplace_back(check_nodes.size());
        }
      }
    }
  }

  for (size_t index = 0; index < target_branch_indexes.size(); ++index) {
    const auto& target_index = target_branch_indexes[index];
    const auto& checked_size = checked_nodes_size_list[index];
    std::vector<ByteData256> check_nodes;
    if (!target_nodes.empty()) {
      size_t copy_len = target_nodes.size() - checked_size;
      for (size_t idx = 0; idx < copy_len; ++idx) {
        check_nodes.emplace_back(target_nodes[idx]);
      }
    }

    try {
      auto new_branch =
          branch_list_[target_index].ChangeTapLeaf(tapscript, check_nodes);
      // ignore invalid target.
      if (new_branch.GetBaseHash().IsEmpty()) continue;

      auto based_branch = *this;
      std::vector<TapBranch> copy_branches;
      for (size_t idx = 0; idx < target_index; ++idx) {
        copy_branches.emplace_back(branch_list_[idx]);
      }
      based_branch.branch_list_ = copy_branches;

      new_branch.AddBranch(based_branch);
      for (size_t idx = target_index + 1; idx < branch_list_.size(); ++idx) {
        new_branch.AddBranch(branch_list_[idx]);
      }
      new_branches.emplace_back(new_branch);
    } catch (const CfdException&) {
      // target not found
    }
  }
  if (new_branches.empty()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "The specified tapscript does not exist under this branch.");
  }
  return new_branches[0];  // response is top data.
}